

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_image_tga.cxx
# Opt level: O2

void __thiscall xray_re::xr_image::save_tga(xr_image *this,xr_writer *w)

{
  undefined2 uVar1;
  char footer [26];
  
  footer._0_4_ = footer._0_4_ & 0xffffff00;
  (*w->_vptr_xr_writer[2])(w,footer,1);
  footer._0_4_ = footer._0_4_ & 0xffffff00;
  (*w->_vptr_xr_writer[2])(w,footer,1);
  footer[0] = '\x02';
  (*w->_vptr_xr_writer[2])(w,footer,1);
  footer._0_4_ = footer._0_4_ & 0xffff0000;
  (*w->_vptr_xr_writer[2])(w,footer,2);
  footer._0_4_ = footer._0_4_ & 0xffff0000;
  (*w->_vptr_xr_writer[2])(w,footer,2);
  footer._0_4_ = footer._0_4_ & 0xffffff00;
  (*w->_vptr_xr_writer[2])(w,footer,1);
  footer._0_4_ = footer._0_4_ & 0xffff0000;
  (*w->_vptr_xr_writer[2])(w,footer,2);
  footer._0_4_ = footer._0_4_ & 0xffff0000;
  (*w->_vptr_xr_writer[2])(w,footer,2);
  footer._0_2_ = *(undefined2 *)&this->m_width;
  (*w->_vptr_xr_writer[2])(w,footer,2);
  uVar1 = (undefined2)this->m_height;
  footer[0] = (char)uVar1;
  footer[1] = (char)((ushort)uVar1 >> 8);
  (*w->_vptr_xr_writer[2])(w,footer,2);
  footer[0] = ' ';
  (*w->_vptr_xr_writer[2])(w,footer,1);
  footer[0] = '/';
  (*w->_vptr_xr_writer[2])(w,footer,1);
  (*w->_vptr_xr_writer[2])(w,this->m_data,(ulong)(this->m_height * this->m_width) << 2);
  builtin_strncpy(footer + 0x10,"ON-XFILE.",10);
  footer[0] = '\0';
  footer[1] = '\0';
  footer[2] = '\0';
  footer[3] = '\0';
  footer[4] = '\0';
  footer[5] = '\0';
  footer[6] = '\0';
  footer[7] = '\0';
  footer[8] = 'T';
  footer[9] = 'R';
  footer[10] = 'U';
  footer[0xb] = 'E';
  footer[0xc] = 'V';
  footer[0xd] = 'I';
  footer[0xe] = 'S';
  footer[0xf] = 'I';
  (*w->_vptr_xr_writer[2])(w,footer,0x1a);
  return;
}

Assistant:

void xr_image::save_tga(xr_writer& w) const
{
	// tga header
	w.w_u8(0);		// ID Length
	w.w_u8(0);		// Color Map Type (none)
	w.w_u8(2);		// Image Type (RGBA)
	w.w_u16(0);
	w.w_u16(0);
	w.w_u8(0);
	w.w_u16(0);		// x
	w.w_u16(0);		// y
	w.w_size_u16(m_width);
	w.w_size_u16(m_height);
	w.w_u8(32);
	w.w_u8(0x2f);
	
	w.w_raw(m_data, m_width*m_height * sizeof(rgba32));

	char footer[] = "\0\0\0\0\0\0\0\0TRUEVISION-XFILE.";
	w.w_raw(footer, sizeof(footer));
}